

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# picojson.h
# Opt level: O1

int __thiscall
picojson::input<boost::asio::buffers_iterator<boost::asio::const_buffer,_char>_>::ungetc
          (input<boost::asio::buffers_iterator<boost::asio::const_buffer,_char>_> *this,int __c,
          FILE *__stream)

{
  int in_EAX;
  runtime_error *this_00;
  undefined4 in_register_00000034;
  
  if (this->last_ch_ != -1) {
    if (this->ungot_ == true) {
      this_00 = (runtime_error *)__cxa_allocate_exception(0x10,CONCAT44(in_register_00000034,__c));
      std::runtime_error::runtime_error(this_00,"! ungot_");
      __cxa_throw(this_00,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
    }
    this->ungot_ = true;
  }
  return in_EAX;
}

Assistant:

void ungetc() {
      if (last_ch_ != -1) {
	PICOJSON_ASSERT(! ungot_);
	ungot_ = true;
      }
    }